

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O2

void __thiscall
Refal2::CGlobalFunctionData::SetEmbeddedFunction
          (CGlobalFunctionData *this,TEmbeddedFunctionPtr _embeddedFunction)

{
  uint __line;
  char *__assertion;
  
  if (this->preparatoryFunction == (CPreparatoryFunction *)0x0 &&
      this->embeddedFunction == (TEmbeddedFunctionPtr)0x0) {
    if (_embeddedFunction != (TEmbeddedFunctionPtr)0x0) {
      this->embeddedFunction = _embeddedFunction;
      return;
    }
    __assertion = "_embeddedFunction != nullptr";
    __line = 0x7c;
  }
  else {
    __assertion = "!IsDefined()";
    __line = 0x7b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                ,__line,
                "void Refal2::CGlobalFunctionData::SetEmbeddedFunction(const TEmbeddedFunctionPtr)")
  ;
}

Assistant:

void CGlobalFunctionData::SetEmbeddedFunction(
	const TEmbeddedFunctionPtr _embeddedFunction )
{
	assert( !IsDefined() );
	assert( _embeddedFunction != nullptr );
	embeddedFunction = _embeddedFunction;
}